

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O0

void __thiscall
mjs::object::define_accessor_property
          (object *this,string *name,object_ptr *accessor,property_attribute attr)

{
  property *this_00;
  object_ptr *args;
  bool bVar1;
  value_type vVar2;
  property_attribute pVar3;
  object *poVar4;
  gc_heap *h;
  gc_vector<mjs::object::property> *this_01;
  bool local_1ba;
  bool local_199;
  value local_190;
  wstring_view local_168;
  value local_158;
  wstring_view local_130;
  pair<mjs::object::property_*,_mjs::gc_vector<mjs::object::property>_*> local_120;
  property *local_110;
  property *it;
  value local_f8;
  byte local_c9;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> local_c8;
  value local_b8;
  byte local_89;
  basic_string_view<wchar_t,_std::char_traits<wchar_t>_> local_88;
  value local_78;
  byte local_39;
  undefined1 local_38 [28];
  property_attribute attr_local;
  object_ptr *accessor_local;
  string *name_local;
  object *this_local;
  
  local_38._20_4_ = attr;
  unique0x10000480 = &accessor->super_gc_heap_ptr_untyped;
  accessor_local = (object_ptr *)name;
  name_local = (string *)this;
  bVar1 = is_valid(attr);
  if (!bVar1) {
    __assert_fail("is_valid(attr)",
                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/object.cpp"
                  ,0x2f,
                  "void mjs::object::define_accessor_property(const string &, const object_ptr &, property_attribute)"
                 );
  }
  bVar1 = gc_heap_ptr_untyped::operator_cast_to_bool(stack0xffffffffffffffe0);
  local_39 = 0;
  local_89 = 0;
  local_c9 = 0;
  local_199 = false;
  if (bVar1) {
    gc_heap_ptr<mjs::object>::operator->((gc_heap_ptr<mjs::object> *)stack0xffffffffffffffe0);
    prototype((object *)local_38);
    local_39 = 1;
    bVar1 = gc_heap_ptr_untyped::operator_cast_to_bool((gc_heap_ptr_untyped *)local_38);
    local_199 = false;
    if (!bVar1) {
      poVar4 = gc_heap_ptr<mjs::object>::operator->
                         ((gc_heap_ptr<mjs::object> *)stack0xffffffffffffffe0);
      std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::basic_string_view
                (&local_88,L"get");
      (**poVar4->_vptr_object)(&local_78,poVar4,&local_88);
      local_89 = 1;
      bVar1 = is_function(&local_78);
      local_1ba = true;
      if (!bVar1) {
        poVar4 = gc_heap_ptr<mjs::object>::operator->
                           ((gc_heap_ptr<mjs::object> *)stack0xffffffffffffffe0);
        std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::basic_string_view
                  (&local_c8,L"set");
        (**poVar4->_vptr_object)(&local_b8,poVar4,&local_c8);
        local_c9 = 1;
        local_1ba = is_function(&local_b8);
      }
      local_199 = local_1ba;
    }
  }
  if (local_199 != false) {
    if ((local_c9 & 1) != 0) {
      value::~value(&local_b8);
    }
    if ((local_89 & 1) != 0) {
      value::~value(&local_78);
    }
    if ((local_39 & 1) != 0) {
      gc_heap_ptr<mjs::object>::~gc_heap_ptr((gc_heap_ptr<mjs::object> *)local_38);
    }
    operator|=((property_attribute *)(local_38 + 0x14),accessor);
    poVar4 = gc_heap_ptr<mjs::object>::operator->
                       ((gc_heap_ptr<mjs::object> *)stack0xffffffffffffffe0);
    std::basic_string_view<wchar_t,_std::char_traits<wchar_t>_>::basic_string_view
              ((basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)&it,L"set");
    (**poVar4->_vptr_object)
              (&local_f8,poVar4,(basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)&it);
    vVar2 = value::type(&local_f8);
    value::~value(&local_f8);
    if (vVar2 == undefined) {
      operator|=((property_attribute *)(local_38 + 0x14),read_only);
    }
    else {
      pVar3 = operator~(read_only);
      operator&=((property_attribute *)(local_38 + 0x14),pVar3);
    }
    local_130 = string::view((string *)accessor_local);
    local_120 = find(this,local_130);
    this_00 = local_120.first;
    local_110 = local_120.first;
    if (local_120.first == (property *)0x0) {
      local_168 = string::view((string *)accessor_local);
      pVar3 = own_property_attributes(this,&local_168);
      bVar1 = is_valid(pVar3);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        __assert_fail("!is_valid(own_property_attributes(name.view()))",
                      "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/object.cpp"
                      ,0x3c,
                      "void mjs::object::define_accessor_property(const string &, const object_ptr &, property_attribute)"
                     );
      }
      h = heap(this);
      this_01 = gc_heap_ptr_untracked<mjs::gc_vector<mjs::object::property>,_true>::dereference
                          (&this->properties_,h);
      args = accessor_local;
      value::value(&local_190,(object_ptr *)stack0xffffffffffffffe0);
      gc_vector<mjs::object::property>::
      emplace_back<mjs::string_const&,mjs::value,mjs::property_attribute&>
                (this_01,(string *)args,&local_190,(property_attribute *)(local_38 + 0x14));
      value::~value(&local_190);
    }
    else {
      value::value(&local_158,(object_ptr *)stack0xffffffffffffffe0);
      property::raw_put(this_00,&local_158);
      value::~value(&local_158);
      property::attributes(local_110,local_38._20_4_);
    }
    return;
  }
  __assert_fail("accessor && !accessor->prototype() && (is_function(accessor->get(L\"get\")) || is_function(accessor->get(L\"set\")))"
                ,"/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/object.cpp",
                0x30,
                "void mjs::object::define_accessor_property(const string &, const object_ptr &, property_attribute)"
               );
}

Assistant:

void object::define_accessor_property(const string& name, const object_ptr& accessor, property_attribute attr) {
    assert(is_valid(attr));
    assert(accessor && !accessor->prototype() && (is_function(accessor->get(L"get")) || is_function(accessor->get(L"set"))));
    attr |= property_attribute::accessor;
    if (accessor->get(L"set").type() != value_type::undefined) {
        attr &= ~property_attribute::read_only;
    } else {
        attr |= property_attribute::read_only;
    }
    if (auto it = find(name.view()).first) {
        it->raw_put(value{accessor});
        it->attributes(attr);
        return;
    }
    assert(!is_valid(own_property_attributes(name.view())));
    properties_.dereference(heap()).emplace_back(name, value{accessor}, attr);
}